

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JoystickImpl.cpp
# Opt level: O1

bool sf::priv::JoystickImpl::isConnected(uint index)

{
  ulong uVar1;
  undefined1 uVar2;
  int iVar3;
  udev_device *udevDevice;
  int iVar4;
  ulong uVar5;
  timeval timeout;
  fd_set descriptorSet;
  timeval local_a8;
  fd_set local_98;
  
  uVar1 = (ulong)index;
  if ((anonymous_namespace)::udevMonitor == 0) {
    anon_unknown.dwarf_abca6::updatePluggedList((udev_device *)0x0);
  }
  else {
    iVar3 = udev_monitor_get_fd();
    local_98.fds_bits[0xe] = 0;
    local_98.fds_bits[0xf] = 0;
    local_98.fds_bits[0xc] = 0;
    local_98.fds_bits[0xd] = 0;
    local_98.fds_bits[10] = 0;
    local_98.fds_bits[0xb] = 0;
    local_98.fds_bits[8] = 0;
    local_98.fds_bits[9] = 0;
    local_98.fds_bits[6] = 0;
    local_98.fds_bits[7] = 0;
    local_98.fds_bits[4] = 0;
    local_98.fds_bits[5] = 0;
    local_98.fds_bits[2] = 0;
    local_98.fds_bits[3] = 0;
    local_98.fds_bits[0] = 0;
    local_98.fds_bits[1] = 0;
    iVar4 = iVar3 + 0x3f;
    if (-1 < iVar3) {
      iVar4 = iVar3;
    }
    uVar5 = 1L << ((byte)iVar3 & 0x3f);
    local_98.fds_bits[iVar4 >> 6] = local_98.fds_bits[iVar4 >> 6] | uVar5;
    local_a8.tv_sec = 0;
    local_a8.tv_usec = 0;
    iVar3 = select(iVar3 + 1,&local_98,(fd_set *)0x0,(fd_set *)0x0,&local_a8);
    if ((0 < iVar3) && ((local_98.fds_bits[iVar4 >> 6] & uVar5) != 0)) {
      udevDevice = (udev_device *)udev_monitor_receive_device((anonymous_namespace)::udevMonitor);
      anon_unknown.dwarf_abca6::updatePluggedList(udevDevice);
      if (udevDevice != (udev_device *)0x0) {
        udev_device_unref(udevDevice);
      }
    }
  }
  uVar5 = (DAT_0022e880 - (anonymous_namespace)::joystickList >> 3) * -0x71c71c71c71c71c7;
  if (uVar5 < uVar1 || uVar5 - uVar1 == 0) {
    uVar2 = 0;
  }
  else {
    uVar2 = *(undefined1 *)((anonymous_namespace)::joystickList + 0x40 + uVar1 * 0x48);
  }
  return (bool)uVar2;
}

Assistant:

bool JoystickImpl::isConnected(unsigned int index)
{
    // See if we can skip scanning if udev monitor is available
    if (!udevMonitor)
    {
        // udev monitor is not available, perform a scan every query
        updatePluggedList();
    }
    else if (hasMonitorEvent())
    {
        // Check if new joysticks were added/removed since last update
        udev_device* udevDevice = udev_monitor_receive_device(udevMonitor);

        // If we can get the specific device, we check that,
        // otherwise just do a full scan if udevDevice == NULL
        updatePluggedList(udevDevice);

        if (udevDevice)
            udev_device_unref(udevDevice);
    }

    if (index >= joystickList.size())
        return false;

    // Then check if the joystick is connected
    return joystickList[index].plugged;
}